

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void __thiscall
GlobalBailOutRecordDataTable::AddOrUpdateRow
          (GlobalBailOutRecordDataTable *this,JitArenaAllocator *allocator,uint32 bailOutRecordId,
          uint32 regSlot,bool isFloat,bool isInt,int32 offset,uint *lastUpdatedRowIndex)

{
  uint uVar1;
  uint32 uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  GlobalBailOutRecordDataRow *pGVar6;
  ulong uVar7;
  
  if (offset == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0xbbf,"(offset != 0)","offset != 0");
    if (!bVar4) goto LAB_003e8599;
    *puVar5 = 0;
  }
  if (this->size == 0) {
    if (this->length != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0xbc3,"(length == 0)","length == 0");
      if (!bVar4) goto LAB_003e8599;
      *puVar5 = 0;
    }
    this->size = 0x40;
    pGVar6 = Memory::AllocateArray<Memory::JitArenaAllocator,GlobalBailOutRecordDataRow,false>
                       ((Memory *)allocator,
                        (JitArenaAllocator *)Memory::JitArenaAllocator::AllocZero,0,0x40);
    this->globalBailOutRecordDataRows = pGVar6;
  }
  if (lastUpdatedRowIndex == (uint *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0xbc8,"(lastUpdatedRowIndex != nullptr)","lastUpdatedRowIndex != nullptr");
    if (!bVar4) goto LAB_003e8599;
    *puVar5 = 0;
  }
  uVar7 = (ulong)*lastUpdatedRowIndex;
  if (uVar7 != 0xffffffff) {
    pGVar6 = this->globalBailOutRecordDataRows;
    if (pGVar6[uVar7].offset == offset) {
      uVar1 = *(uint *)&pGVar6[uVar7].field_0xc;
      if (((-1 < (int)uVar1 != isInt) && (((uVar1 >> 0x1e & 1) == 0) != isFloat)) &&
         (pGVar6[uVar7].end + 1 == bailOutRecordId)) {
        if ((uVar1 & 0x3fffffff) != regSlot) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0xbd2,"(rowToUpdate->regSlot == regSlot)",
                             "rowToUpdate->regSlot == regSlot");
          if (!bVar4) {
LAB_003e8599:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar5 = 0;
        }
        pGVar6[uVar7].end = bailOutRecordId;
        return;
      }
    }
  }
  uVar1 = this->length;
  uVar7 = (ulong)uVar1;
  if (uVar1 == this->size) {
    this->size = uVar1 * 2;
    pGVar6 = (GlobalBailOutRecordDataRow *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Realloc
                       ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                        allocator,this->globalBailOutRecordDataRows,uVar7 << 4,
                        (ulong)(uVar1 * 2) << 4);
    this->globalBailOutRecordDataRows = pGVar6;
    uVar7 = (ulong)this->length;
  }
  else {
    pGVar6 = this->globalBailOutRecordDataRows;
  }
  pGVar6[uVar7].start = bailOutRecordId;
  pGVar6[uVar7].end = bailOutRecordId;
  pGVar6[uVar7].offset = offset;
  *(uint32 *)&pGVar6[uVar7].field_0xc =
       regSlot & 0x3fffffff | (uint)isFloat << 0x1e | (uint)isInt << 0x1f;
  uVar2 = this->length;
  this->length = uVar2 + 1;
  *lastUpdatedRowIndex = uVar2;
  return;
}

Assistant:

void  GlobalBailOutRecordDataTable::AddOrUpdateRow(JitArenaAllocator *allocator, uint32 bailOutRecordId, uint32 regSlot, bool isFloat, bool isInt, int32 offset, uint *lastUpdatedRowIndex)
{
    Assert(offset != 0);
    const int INITIAL_TABLE_SIZE = 64;
    if (size == 0)
    {
        Assert(length == 0);
        size = INITIAL_TABLE_SIZE;
        globalBailOutRecordDataRows = JitAnewArrayZ(allocator, GlobalBailOutRecordDataRow, size);
    }

    Assert(lastUpdatedRowIndex != nullptr);

    if ((*lastUpdatedRowIndex) != -1)
    {
        GlobalBailOutRecordDataRow *rowToUpdate = &globalBailOutRecordDataRows[(*lastUpdatedRowIndex)];
        if(rowToUpdate->offset == offset &&
            rowToUpdate->isInt == (unsigned)isInt &&
            rowToUpdate->isFloat == (unsigned)isFloat &&
            rowToUpdate->end + 1 == bailOutRecordId)
        {
            Assert(rowToUpdate->regSlot == regSlot);
            rowToUpdate->end = bailOutRecordId;
            return;
        }
    }

    if (length == size)
    {
        size = length << 1;
        globalBailOutRecordDataRows = (GlobalBailOutRecordDataRow *)allocator->Realloc(globalBailOutRecordDataRows, length * sizeof(GlobalBailOutRecordDataRow), size * sizeof(GlobalBailOutRecordDataRow));
    }
    GlobalBailOutRecordDataRow *rowToInsert = &globalBailOutRecordDataRows[length];
    rowToInsert->start = bailOutRecordId;
    rowToInsert->end = bailOutRecordId;
    rowToInsert->offset = offset;
    rowToInsert->isFloat = isFloat;
    rowToInsert->isInt = isInt;
    rowToInsert->regSlot = regSlot;
    *lastUpdatedRowIndex = length++;
}